

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::~TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this)

{
  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this_local;
  
  Animatable<bool>::~Animatable(&this->_fallback);
  nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::~optional(&this->_attrib);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }